

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

void __thiscall
diligent_spirv_cross::
SmallVector<std::unique_ptr<diligent_spirv_cross::SPIRExpression,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::MallocDeleter>,_8UL>
::clear(SmallVector<std::unique_ptr<diligent_spirv_cross::SPIRExpression,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::MallocDeleter>,_8UL>
        *this)

{
  long lVar1;
  size_t i;
  ulong uVar2;
  
  lVar1 = 0;
  for (uVar2 = 0;
      uVar2 < (this->
              super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRExpression,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::MallocDeleter>_>
              ).buffer_size; uVar2 = uVar2 + 1) {
    ::std::
    unique_ptr<diligent_spirv_cross::SPIRExpression,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::MallocDeleter>
    ::~unique_ptr((unique_ptr<diligent_spirv_cross::SPIRExpression,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::MallocDeleter>
                   *)((long)&(((this->
                               super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRExpression,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::MallocDeleter>_>
                               ).ptr)->_M_t).
                             super___uniq_ptr_impl<diligent_spirv_cross::SPIRExpression,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::MallocDeleter>
                             ._M_t.
                             super__Tuple_impl<0UL,_diligent_spirv_cross::SPIRExpression_*,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::MallocDeleter>
                             .super__Head_base<0UL,_diligent_spirv_cross::SPIRExpression_*,_false> +
                     lVar1));
    lVar1 = lVar1 + 8;
  }
  (this->
  super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRExpression,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::MallocDeleter>_>
  ).buffer_size = 0;
  return;
}

Assistant:

void clear() SPIRV_CROSS_NOEXCEPT
	{
		for (size_t i = 0; i < this->buffer_size; i++)
			this->ptr[i].~T();
		this->buffer_size = 0;
	}